

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

int __thiscall minihttp::TcpSocket::_writeBytes(TcpSocket *this,uchar *buf,size_t len)

{
  ssize_t sVar1;
  
  sVar1 = send((int)this->_s,buf,len,0x4000);
  return (int)sVar1;
}

Assistant:

int TcpSocket::_writeBytes(const unsigned char *buf, size_t len)
{
    int ret = 0;

#ifdef MINIHTTP_USE_MBEDTLS
    int err;
    if(_sslctx)
        err = mbedtls_ssl_write(&((SSLCtx*)_sslctx)->ssl, buf, len);
    else
        err = mbedtls_net_send(&_s, buf, len);

    switch(err)
    {
        case MBEDTLS_ERR_SSL_WANT_WRITE:
            ret = 0; // FIXME: Nothing written, try later?
        default:
            ret = err;
    }
#else
    int flags = 0;
    #ifdef MSG_NOSIGNAL
       flags |= MSG_NOSIGNAL;
    #endif
    return ::send(_s, (const char*)buf, len, flags);
#endif

    return ret;
}